

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

void anm_free(anm_archive_t *anm)

{
  uchar *puVar1;
  long *__ptr;
  void *pvVar2;
  list_node_t *plVar3;
  list_node_t *plVar4;
  list_node_t *plVar5;
  long *plVar6;
  
  puVar1 = anm->map;
  plVar3 = (list_node_t *)&anm->names;
  while (plVar3 = plVar3->next, plVar3 != (list_node_t *)0x0) {
    free(plVar3->data);
  }
  list_free_nodes(&anm->names);
  plVar3 = (list_node_t *)&anm->entries;
  while (plVar3 = plVar3->next, plVar3 != (list_node_t *)0x0) {
    __ptr = (long *)plVar3->data;
    plVar4 = (list_node_t *)(__ptr + 9);
    while (plVar4 = plVar4->next, plVar4 != (list_node_t *)0x0) {
      pvVar2 = plVar4->data;
      if (puVar1 == (uchar *)0x0) {
        free(*(void **)((long)pvVar2 + 8));
      }
      plVar5 = (list_node_t *)((long)pvVar2 + 0x10);
      while (plVar5 = plVar5->next, plVar5 != (list_node_t *)0x0) {
        thanm_instr_free((thanm_instr_t *)plVar5->data);
      }
      if ((puVar1 == (uchar *)0x0) || (*(int *)(*__ptr + 0x28) == 0)) {
        plVar6 = (long *)((long)pvVar2 + 0x20);
        while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
          free((void *)plVar6[2]);
        }
      }
      list_free_nodes((list_t *)((long)pvVar2 + 0x10));
      list_free_nodes((list_t *)((long)pvVar2 + 0x20));
      free(pvVar2);
    }
    list_free_nodes((list_t *)(__ptr + 9));
    pvVar2 = (void *)*__ptr;
    if (puVar1 == (uchar *)0x0) {
      free(pvVar2);
      free((void *)__ptr[1]);
      free((void *)__ptr[3]);
      free((void *)__ptr[0xb]);
      plVar6 = __ptr + 7;
      while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
        free((void *)plVar6[2]);
      }
    }
    else if (6 < *(uint *)((long)pvVar2 + 0x28)) {
      free(pvVar2);
    }
    list_free_nodes((list_t *)(__ptr + 7));
    free((void *)__ptr[4]);
    free(__ptr);
  }
  list_free_nodes(&anm->entries);
  if (puVar1 != (uchar *)0x0) {
    file_munmap(anm->map,anm->map_size);
  }
  free(anm);
  return;
}

Assistant:

static void
anm_free(
    anm_archive_t* anm)
{
    int is_mapped = anm->map != NULL;

    char* name;
    list_for_each(&anm->names, name)
        free(name);
    list_free_nodes(&anm->names);

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        anm_script_t* script;
        list_for_each(&entry->scripts, script) {
            if (!is_mapped)
                free(script->offset);

            thanm_instr_t* instr;
            list_for_each(&script->instrs, instr) {
                thanm_instr_free(instr);
            }
            if (!is_mapped || entry->header->version == 0) {
                anm_instr_t* instr;
                list_for_each(&script->raw_instrs, instr) {
                    free(instr);
                }
            }
            list_free_nodes(&script->instrs);
            list_free_nodes(&script->raw_instrs);

            free(script);
        }
        list_free_nodes(&entry->scripts);

        if (!is_mapped) {
            free(entry->header);
            free(entry->thtx);
            free(entry->name2);
            free(entry->data);

            sprite19_t* sprite;
            list_for_each(&entry->sprites, sprite)
                free(sprite);
        } else if (entry->header->version >= 7) {
            free(entry->header);
        }
        list_free_nodes(&entry->sprites);

        free(entry->filename);
        free(entry);
    }
    list_free_nodes(&anm->entries);

    if (is_mapped)
        file_munmap(anm->map, anm->map_size);

    free(anm);
}